

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

bool launch(QString *launcher,QUrl *url,QString *xdgActivationToken)

{
  char cVar1;
  QLoggingCategory *pQVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QArrayDataPointer<QString> QStack_c8;
  QProcessEnvironment env;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QLatin1String> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::toEncoded(&local_98,url,0x1f00000);
  local_58.a.b = L' ';
  local_58.b.m_size._0_4_ = (undefined4)local_98.size;
  local_58.b.m_size._4_4_ = (undefined4)((ulong)local_98.size >> 0x20);
  local_58.b.m_data = (char *)local_98.ptr;
  local_58.a.a = launcher;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QLatin1String>::convertTo<QString>
            ((QString *)&local_78,&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  pQVar2 = QtPrivateLogging::lcQpaServices();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_58.b.m_data = pQVar2->name;
    local_58.a.a._0_4_ = 2;
    local_58.a.a._4_4_ = 0;
    local_58.a.b = L'\0';
    local_58.a._10_2_ = 0;
    local_58.a._12_4_ = 0;
    local_58.b.m_size._0_4_ = 0;
    local_58.b.m_size._4_4_ = 0;
    QString::toLocal8Bit((QByteArray *)&local_98,(QString *)&local_78);
    if (local_98.ptr == (QString *)0x0) {
      local_98.ptr = (QString *)&QByteArray::_empty;
    }
    QMessageLogger::debug((char *)&local_58,"Launching %s",local_98.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QVar4.m_data = (storage_type_conflict *)local_78.size;
  QVar4.m_size = (qsizetype)&local_98;
  QProcess::splitCommand(QVar4);
  if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
    local_58.b.m_size._0_4_ = 0xaaaaaaaa;
    local_58.b.m_size._4_4_ = 0xaaaaaaaa;
    local_58.a.a._0_4_ = 0xaaaaaaaa;
    local_58.a.a._4_4_ = 0xaaaaaaaa;
    local_58.a.b = L'ꪪ';
    local_58.a._10_2_ = 0xaaaa;
    local_58.a._12_4_ = 0xaaaaaaaa;
    QList<QString>::takeFirst((value_type *)&local_58,(QList<QString> *)&local_98);
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QProcess::QProcess((QProcess *)&local_a8,(QObject *)0x0);
    QProcess::setProgram((QString *)&local_a8);
    QProcess::setArguments((QList_conflict1 *)&local_a8);
    if ((xdgActivationToken->d).size != 0) {
      _env = &DAT_aaaaaaaaaaaaaaaa;
      QProcessEnvironment::systemEnvironment();
      Qt::Literals::StringLiterals::operator____s
                ((QString *)&QStack_c8,L"XDG_ACTIVATION_TOKEN",0x14);
      QProcessEnvironment::insert((QString *)&env,(QString *)&QStack_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&QStack_c8);
      QProcessEnvironment::toStringList();
      QProcess::setEnvironment((QList_conflict1 *)&local_a8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_c8);
      QProcessEnvironment::~QProcessEnvironment(&env);
    }
    cVar1 = QProcess::startDetached((longlong *)&local_a8);
    QProcess::~QProcess((QProcess *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    bVar3 = true;
    if (cVar1 != '\0') goto LAB_0057e542;
  }
  pQVar2 = QtPrivateLogging::lcQpaServices();
  if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0) {
    bVar3 = false;
  }
  else {
    local_58.b.m_data = pQVar2->name;
    local_58.a.a._0_4_ = 2;
    local_58.a.a._4_4_ = 0;
    local_58.a.b = L'\0';
    local_58.a._10_2_ = 0;
    local_58.a._12_4_ = 0;
    local_58.b.m_size._0_4_ = 0;
    local_58.b.m_size._4_4_ = 0;
    QString::toLocal8Bit((QByteArray *)&QStack_c8,(QString *)&local_78);
    if (QStack_c8.ptr == (QString *)0x0) {
      QStack_c8.ptr = (QString *)&QByteArray::_empty;
    }
    bVar3 = false;
    QMessageLogger::warning((char *)&local_58,"Launch failed (%s)",QStack_c8.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&QStack_c8);
  }
LAB_0057e542:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool launch(const QString &launcher, const QUrl &url,
                          const QString &xdgActivationToken)
{

    const QString command = launcher + u' ' + QLatin1StringView(url.toEncoded());
    qCDebug(lcQpaServices, "Launching %s", qPrintable(command));
#if !QT_CONFIG(process)
    if (!xdgActivationToken.isEmpty())
        qputenv("XDG_ACTIVATION_TOKEN", xdgActivationToken.toUtf8());
    const bool ok = ::system(qPrintable(command + " &"_L1));
    if (!xdgActivationToken.isEmpty())
        qunsetenv("XDG_ACTIVATION_TOKEN");
#  else
    QStringList args = QProcess::splitCommand(command);
    bool ok = false;
    if (!args.isEmpty()) {
        QString program = args.takeFirst();
        QProcess process;
        process.setProgram(program);
        process.setArguments(args);

        if (!xdgActivationToken.isEmpty()) {
            auto env = QProcessEnvironment::systemEnvironment();
            env.insert(u"XDG_ACTIVATION_TOKEN"_s, xdgActivationToken);
            process.setEnvironment(env.toStringList());
        }
        ok = process.startDetached(nullptr);
    }
#  endif
    if (!ok)
        qCWarning(lcQpaServices, "Launch failed (%s)", qPrintable(command));

    return ok;
}